

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void handleSpans<BlendSrcGenericRGB64>(int count,QT_FT_Span *spans,QSpanData *data,Operator *op)

{
  int iVar1;
  int iVar2;
  QThreadPool *pQVar3;
  ulong uVar4;
  int *in_RCX;
  long *in_RDX;
  int in_EDI;
  long in_FS_OFFSET;
  int cn;
  int i;
  int c;
  QThreadPool *threadPool;
  int segments;
  bool solidSource;
  int const_alpha;
  QSemaphore semaphore;
  anon_class_32_5_c407124e function;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 uVar5;
  int iVar6;
  int local_88;
  int local_84;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined1 *local_30 [4];
  bool local_10;
  undefined1 auStack_f [7];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(ushort *)(in_RDX + 0x11) & 0xff) == 5) {
    iVar6 = (int)in_RDX[0x1d];
  }
  else {
    iVar6 = 0x100;
  }
  uVar5 = *in_RCX == 3 && iVar6 == 0x100;
  _local_10 = CONCAT71(0xaaaaaaaaaaaaaa,uVar5);
  _local_10 = CONCAT44(iVar6,_local_10);
  iVar1 = (in_EDI + 0x20) / 0x40;
  pQVar3 = QGuiApplicationPrivate::qtGuiThreadPool();
  if (((1 < iVar1) && (2 < (int)qPixelLayouts[*(uint *)(*in_RDX + 0x10)].bpp)) &&
     (pQVar3 != (QThreadPool *)0x0)) {
    QThread::currentThread();
    uVar4 = QThreadPool::contains((QThread *)pQVar3);
    if ((uVar4 & 1) == 0) {
      local_30[0] = &DAT_aaaaaaaaaaaaaaaa;
      QSemaphore::QSemaphore((QSemaphore *)local_30,0);
      local_84 = 0;
      for (local_88 = 0; local_88 < iVar1; local_88 = local_88 + 1) {
        iVar2 = (in_EDI - local_84) / (iVar1 - local_88);
        QThreadPool::
        start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_gui_painting_qdrawhelper_cpp:4205:5),_true>
                  ((QThreadPool *)CONCAT44(iVar2,iVar6),
                   (anon_class_24_4_b418dff8_for_o *)CONCAT17(uVar5,in_stack_ffffffffffffff68),
                   (int)((ulong)pQVar3 >> 0x20));
        local_84 = iVar2 + local_84;
      }
      QSemaphore::acquire((int)local_30);
      QSemaphore::~QSemaphore((QSemaphore *)local_30);
      goto LAB_00b7c606;
    }
  }
  handleSpans<BlendSrcGenericRGB64>::anon_class_32_5_c407124e::operator()
            ((anon_class_32_5_c407124e *)
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_EDI,
             in_stack_ffffffffffffffb0);
LAB_00b7c606:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void handleSpans(int count, const QT_FT_Span *spans, const QSpanData *data, const Operator &op)
{
    const int const_alpha = (data->type == QSpanData::Texture) ? data->texture.const_alpha : 256;
    const bool solidSource = op.mode == QPainter::CompositionMode_Source && const_alpha == 256;

    auto function = [=, &op] (int cStart, int cEnd)
    {
        T Q_DECL_UNINITIALIZED handler(data, op);
        int coverage = 0;
        for (int c = cStart; c < cEnd;) {
            if (!spans[c].len) {
                ++c;
                continue;
            }
            int x = spans[c].x;
            const int y = spans[c].y;
            int right = x + spans[c].len;
            const bool fetchDest = !solidSource || spans[c].coverage < 255;

            // compute length of adjacent spans
            for (int i = c + 1; i < cEnd && spans[i].y == y && spans[i].x == right && fetchDest == (!solidSource || spans[i].coverage < 255); ++i)
                right += spans[i].len;
            int length = right - x;

            while (length) {
                int l = qMin(BufferSize, length);
                length -= l;

                int process_length = l;
                int process_x = x;

                const auto *src = handler.fetch(process_x, y, process_length, fetchDest);
                int offset = 0;
                while (l > 0) {
                    if (x == spans[c].x) // new span?
                        coverage = (spans[c].coverage * const_alpha) >> 8;

                    int right = spans[c].x + spans[c].len;
                    int len = qMin(l, right - x);

                    handler.process(x, y, len, coverage, src, offset);

                    l -= len;
                    x += len;
                    offset += len;

                    if (x == right) // done with current span?
                        ++c;
                }
                handler.store(process_x, y, process_length);
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}